

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::WallyUtil::CreateScriptDataFromBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes,int32_t flags)

{
  uchar *puVar1;
  uchar *bytes_out;
  int iVar2;
  CfdException *this;
  pointer __n;
  allocator local_49;
  size_t written;
  undefined1 local_40 [32];
  
  __n = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish +
        (5 - (long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(size_type)__n,(allocator_type *)local_40);
  written = 0;
  puVar1 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = wally_script_push_from_bytes
                    (puVar1,(long)(bytes->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,flags,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start,(size_t)__n,&written);
  if (iVar2 != 0) {
LAB_00354ef5:
    local_40._0_8_ = "cfdcore_wally_util.cpp";
    local_40._8_4_ = 0x95;
    local_40._16_8_ = "CreateScriptDataFromBytes";
    logger::warn<>((CfdSourceLocation *)local_40,"Script push error.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_40,"Script push error.",&local_49);
    CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (__n < written) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,written);
    puVar1 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bytes_out = (__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
    iVar2 = wally_script_push_from_bytes
                      (puVar1,(long)(bytes->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,flags
                       ,bytes_out,
                       (long)(__return_storage_ptr__->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)bytes_out,&written);
    if (iVar2 != 0) goto LAB_00354ef5;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,written);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> WallyUtil::CreateScriptDataFromBytes(
    const std::vector<uint8_t>& bytes, int32_t flags) {
  size_t write_max_size = bytes.size() + kMaxVarIntSize;
  std::vector<uint8_t> ret_bytes(write_max_size);
  size_t written = 0;

  int ret = wally_script_push_from_bytes(
      bytes.data(), bytes.size(), flags, ret_bytes.data(), write_max_size,
      &written);
  if (ret == WALLY_OK && write_max_size < written) {
    // サイズ不足の場合はresizeしてリトライ
    ret_bytes.resize(written);
    ret = wally_script_push_from_bytes(
        bytes.data(), bytes.size(), flags, ret_bytes.data(), ret_bytes.size(),
        &written);
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Script push error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script push error.");
  }
  ret_bytes.resize(written);
  return ret_bytes;
}